

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

void __thiscall
axl::sl::StringRefBase<short,_axl::sl::StringDetailsBase<short>_>::attachBufHdr
          (StringRefBase<short,_axl::sl::StringDetailsBase<short>_> *this,BufHdr *hdr)

{
  RefCount *in_RSI;
  long in_RDI;
  
  if (in_RSI != *(RefCount **)(in_RDI + 8)) {
    if (in_RSI != (RefCount *)0x0) {
      rc::RefCount::addRef((RefCount *)0x18c316);
    }
    if (*(long *)(in_RDI + 8) != 0) {
      rc::RefCount::release(in_RSI);
    }
    *(RefCount **)(in_RDI + 8) = in_RSI;
  }
  return;
}

Assistant:

void
	attachBufHdr(rc::BufHdr* hdr) const {
		if (hdr == m_hdr)
			return; // try to avoid unnecessary interlocked ops

		if (hdr)
			hdr->addRef();

		if (m_hdr)
			m_hdr->release();

		m_hdr = hdr;
	}